

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

bool __thiscall Minisat::IntOption::parse(IntOption *this,char *str)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  char *end;
  char *local_20;
  
  if (*str == '-') {
    pcVar6 = str + (*str == '-');
    pcVar3 = (this->super_Option).name;
    cVar2 = *pcVar3;
    bVar7 = cVar2 == '\0';
    if (bVar7) {
      lVar4 = 0;
LAB_0010322d:
      pcVar6 = pcVar6 + lVar4;
    }
    else if (*pcVar6 == cVar2) {
      lVar4 = 1;
      do {
        cVar2 = pcVar3[lVar4];
        bVar7 = cVar2 == '\0';
        if (bVar7) goto LAB_0010322d;
        pcVar1 = pcVar6 + lVar4;
        lVar4 = lVar4 + 1;
      } while (*pcVar1 == cVar2);
    }
    else {
      bVar7 = false;
    }
    if ((bVar7) && (*pcVar6 == '=')) {
      lVar4 = strtol(pcVar6 + (*pcVar6 == '='),&local_20,10);
      bVar7 = local_20 != (char *)0x0;
      if (!bVar7) {
        return bVar7;
      }
      iVar5 = (int)lVar4;
      if ((this->range).end < iVar5) {
        parse();
      }
      else if ((this->range).begin <= iVar5) {
        this->value = iVar5;
        return bVar7;
      }
      parse();
      if (Option::getOptionList()::options == '\0') {
        Option::getOptionList();
      }
      return true;
    }
  }
  return false;
}

Assistant:

Int64Range(int64_t b, int64_t e) : begin(b), end(e) {}